

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O1

void crnlib::split_vectors<crnlib::vec<1u,float>>
               (vec<1U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<1U,_float> (*result) [2])

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  uint i;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float in_XMM5_Da;
  float fVar14;
  double in_XMM6_Qa;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  double weightedDotProducts [64];
  float afStack_318 [64];
  double adStack_218 [64];
  
  uVar1 = (ulong)size;
  if (size == 0) {
    dVar10 = 0.0;
    fVar11 = 0.0;
    fVar12 = 0.0;
  }
  else {
    fVar11 = 0.0;
    dVar10 = 0.0;
    uVar6 = 0;
    uVar5 = 0;
    do {
      uVar7 = (*weights)[uVar6];
      fVar8 = (float)uVar7;
      fVar12 = (*vectors)[uVar6].m_s[0];
      fVar13 = fVar12 * fVar8;
      afStack_318[uVar6] = fVar13;
      fVar11 = fVar11 + fVar13;
      uVar5 = uVar5 + uVar7;
      dVar9 = (double)(fVar12 * fVar12 * fVar8);
      adStack_218[uVar6] = dVar9;
      dVar10 = dVar10 + dVar9;
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
    if ((long)uVar5 < 0) {
      fVar12 = (float)uVar5;
    }
    else {
      fVar12 = (float)(long)uVar5;
    }
  }
  fVar12 = 1.0 / fVar12;
  fVar8 = fVar11 * fVar12;
  (*result)[1].m_s[0] = fVar8;
  (*result)[0].m_s[0] = fVar8;
  if (size != 1) {
    fVar11 = (float)(dVar10 - (double)(fVar11 * fVar11 * fVar12));
    dVar10 = 0.0;
    if (0.0 < fVar11) {
      if (size != 0) {
        dVar10 = -1.0;
        uVar5 = 0;
        do {
          fVar11 = (*vectors)[uVar5].m_s[0];
          fVar13 = fVar11 - fVar8;
          in_XMM6_Qa = (double)(fVar13 * fVar13);
          if (in_XMM6_Qa <= dVar10) {
            fVar11 = in_XMM5_Da;
          }
          if (dVar10 <= in_XMM6_Qa) {
            dVar10 = in_XMM6_Qa;
          }
          uVar5 = uVar5 + 1;
          in_XMM5_Da = fVar11;
        } while (uVar1 != uVar5);
      }
      fVar13 = SUB84(dVar10,0);
      if (size != 0) {
        fVar14 = -1.0;
        uVar5 = 0;
        do {
          fVar13 = (*vectors)[uVar5].m_s[0];
          fVar15 = (fVar13 - fVar11) * (fVar13 - fVar11);
          if (fVar15 <= fVar14) {
            fVar13 = SUB84(in_XMM6_Qa,0);
          }
          if (fVar14 <= fVar15) {
            fVar14 = fVar15;
          }
          uVar5 = uVar5 + 1;
          in_XMM6_Qa = (double)(ulong)(uint)fVar13;
        } while (uVar1 != uVar5);
      }
      fVar11 = (fVar11 + fVar8) * 0.5;
      fVar13 = (fVar13 + fVar8) * 0.5;
      if (2 < size) {
        fVar14 = 0.0;
        uVar5 = 0;
        do {
          fVar15 = (*vectors)[uVar5].m_s[0] - fVar8;
          fVar14 = fVar14 + fVar15 * fVar15 * (float)(*weights)[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
        iVar4 = 10;
        fVar15 = 1.0;
        do {
          fVar15 = fVar15 * fVar14 * fVar12;
          uVar7 = -(uint)(fVar15 != 0.0);
          fVar15 = (float)(uVar7 & 0x3f800000 | ~uVar7 & (uint)fVar15);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        uVar7 = -(uint)(fVar15 * fVar15 != 0.0);
        dVar9 = 0.0;
        uVar5 = 0;
        dVar10 = 0.0;
        fVar12 = 0.0;
        fVar14 = 0.0;
        do {
          if (0.0 <= ((*vectors)[uVar5].m_s[0] - fVar8) *
                     (float)(~uVar7 & 0x3f800000 | (uint)(1.0 / SQRT(fVar15 * fVar15)) & uVar7) *
                     fVar15) {
            fVar12 = fVar12 + afStack_318[uVar5];
            dVar9 = dVar9 + (double)(*weights)[uVar5];
          }
          else {
            fVar14 = fVar14 + afStack_318[uVar5];
            dVar10 = dVar10 + (double)(*weights)[uVar5];
          }
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
        if ((0.0 < dVar10) && (0.0 < dVar9)) {
          fVar11 = fVar14 * (float)(1.0 / dVar10);
          fVar13 = fVar12 * (float)(1.0 / dVar9);
        }
      }
      fVar12 = 1e+10;
      iVar4 = 0;
      do {
        if (size == 0) {
          dVar10 = 0.0;
          fVar14 = 0.0;
          fVar8 = 0.0;
          uVar6 = 0;
          uVar5 = 0;
          dVar9 = 0.0;
        }
        else {
          fVar8 = 0.0;
          auVar16 = ZEXT816(0);
          uVar3 = 0;
          dVar10 = 0.0;
          uVar5 = 0;
          uVar6 = 0;
          fVar14 = 0.0;
          do {
            fVar15 = (*vectors)[uVar3].m_s[0];
            fVar17 = fVar11 - fVar15;
            fVar15 = fVar13 - fVar15;
            if (fVar15 * fVar15 <= fVar17 * fVar17) {
              fVar8 = fVar8 + afStack_318[uVar3];
              auVar16._0_8_ = auVar16._0_8_ + adStack_218[uVar3];
              uVar5 = uVar5 + (*weights)[uVar3];
            }
            else {
              fVar14 = fVar14 + afStack_318[uVar3];
              dVar10 = dVar10 + adStack_218[uVar3];
              uVar6 = uVar6 + (*weights)[uVar3];
            }
            dVar9 = auVar16._0_8_;
            uVar3 = uVar3 + 1;
          } while (uVar1 != uVar3);
        }
        iVar2 = 1;
        if (uVar6 != 0 && uVar5 != 0) {
          fVar11 = (1.0 / (float)uVar6) * fVar14;
          fVar13 = (1.0 / (float)uVar5) * fVar8;
          fVar8 = (float)(dVar9 - (double)(fVar8 * fVar8 * (1.0 / (float)uVar5))) +
                  (float)(dVar10 - (double)(fVar14 * fVar14 * (1.0 / (float)uVar6)));
          iVar2 = 0x26;
          if (1e-05 <= fVar8) {
            fVar14 = (fVar12 - fVar8) / fVar8;
            uVar7 = -(uint)(fVar14 < 1e-05);
            fVar12 = (float)((uint)fVar12 & uVar7 | ~uVar7 & (uint)fVar8);
            iVar2 = 0;
            if (fVar14 < 1e-05) {
              iVar2 = 0x26;
            }
          }
        }
        if (iVar2 != 0) goto LAB_001775d3;
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0x400);
      iVar2 = 0x26;
LAB_001775d3:
      if (iVar2 == 0x26) {
        (*result)[0].m_s[0] = fVar11;
        (*result)[1].m_s[0] = fVar13;
      }
    }
  }
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2]) {
  VectorType weightedVectors[64];
  double weightedDotProducts[64];
  VectorType centroid(cClear);
  uint64 total_weight = 0;
  double ttsum = 0.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    const uint weight = weights[i];
    weightedVectors[i] = v * (float)weight;
    centroid += weightedVectors[i];
    total_weight += weight;
    weightedDotProducts[i] = v.dot(v) * weight;
    ttsum += weightedDotProducts[i];
  }
  float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
  centroid *= (1.0f / total_weight);
  result[0] = result[1] = centroid;
  if (variance <= 0.0f || size == 1)
    return;
  VectorType furthest;
  double furthest_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(centroid);
    if (dist > furthest_dist) {
      furthest_dist = dist;
      furthest = v;
    }
  }
  VectorType opposite;
  double opposite_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(furthest);
    if (dist > opposite_dist) {
      opposite_dist = dist;
      opposite = v;
    }
  }
  VectorType left_child((furthest + centroid) * .5f);
  VectorType right_child((opposite + centroid) * .5f);
  if (size > 2) {
    const uint N = VectorType::num_elements;
    matrix<N, N, float> covar;
    covar.clear();
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i] - centroid;
      const VectorType w = v * (float)weights[i];
      for (uint x = 0; x < N; x++) {
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
      }
    }
    float divider = (float)total_weight;
    for (uint x = 0; x < N; x++) {
      for (uint y = x; y < N; y++) {
        covar[x][y] /= divider;
        covar[y][x] = covar[x][y];
      }
    }
    VectorType axis(1.0f);
    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;
      double max_sum = 0;
      for (uint i = 0; i < N; i++) {
        double sum = 0;
        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];
        x[i] = (float)sum;
        max_sum = i ? math::maximum(max_sum, sum) : sum;
      }
      if (max_sum != 0.0f)
        x *= (float)(1.0f / max_sum);
      axis = x;
    }
    axis.normalize();
    VectorType new_left_child(0.0f);
    VectorType new_right_child(0.0f);
    double left_weight = 0.0f;
    double right_weight = 0.0f;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      const float weight = (float)weights[i];
      double t = (v - centroid) * axis;
      if (t < 0.0f) {
        new_left_child += weightedVectors[i];
        left_weight += weight;
      } else {
        new_right_child += weightedVectors[i];
        right_weight += weight;
      }
    }
    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child = new_left_child * (float)(1.0f / left_weight);
      right_child = new_right_child * (float)(1.0f / right_weight);
    }
  }
  uint64 left_weight = 0;
  uint64 right_weight = 0;
  float prev_total_variance = 1e+10f;
  float left_variance = 0.0f;
  float right_variance = 0.0f;
  const uint cMaxLoops = 1024;
  for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++) {
    VectorType new_left_child(cClear);
    VectorType new_right_child(cClear);
    double left_ttsum = 0.0f;
    double right_ttsum = 0.0f;
    left_weight = 0;
    right_weight = 0;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      double left_dist2 = left_child.squared_distance(v);
      double right_dist2 = right_child.squared_distance(v);
      if (left_dist2 < right_dist2) {
        new_left_child += weightedVectors[i];
        left_ttsum += weightedDotProducts[i];
        left_weight += weights[i];
      } else {
        new_right_child += weightedVectors[i];
        right_ttsum += weightedDotProducts[i];
        right_weight += weights[i];
      }
    }
    if ((!left_weight) || (!right_weight))
      return;
    left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
    right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
    new_left_child *= (1.0f / left_weight);
    new_right_child *= (1.0f / right_weight);
    left_child = new_left_child;
    right_child = new_right_child;
    float total_variance = left_variance + right_variance;
    if (total_variance < .00001f)
      break;
    if (((prev_total_variance - total_variance) / total_variance) < .00001f)
      break;
    prev_total_variance = total_variance;
  }
  result[0] = left_child;
  result[1] = right_child;
}